

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mutex.cpp
# Opt level: O0

void __thiscall SharedMutex::SharedMutex(SharedMutex *this)

{
  int iVar1;
  __pid_t _Var2;
  ContextManager *pCVar3;
  pointer this_00;
  pthread_mutex_t *__mutex;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  pthread_mutexattr_t local_28 [2];
  pthread_mutexattr_t mutexattr;
  unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  local_18;
  SharedMutex *local_10;
  SharedMutex *this_local;
  
  local_10 = this;
  std::
  unique_ptr<SharedMemoryObject<pthread_mutex_t>,std::default_delete<SharedMemoryObject<pthread_mutex_t>>>
  ::unique_ptr<std::default_delete<SharedMemoryObject<pthread_mutex_t>>,void>
            ((unique_ptr<SharedMemoryObject<pthread_mutex_t>,std::default_delete<SharedMemoryObject<pthread_mutex_t>>>
              *)this);
  std::make_unique<SharedMemoryObject<pthread_mutex_t>>();
  std::
  unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  ::operator=(&this->mutex_,&local_18);
  std::
  unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
  ::~unique_ptr(&local_18);
  iVar1 = pthread_mutexattr_init(local_28);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_48,"Failed to initialize mutexattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  iVar1 = pthread_mutexattr_setpshared(local_28,1);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_68,"Failed to set PTHREAD_PROCESS_SHARED to mutexattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  this_00 = std::
            unique_ptr<SharedMemoryObject<pthread_mutex_t>,_std::default_delete<SharedMemoryObject<pthread_mutex_t>_>_>
            ::operator->(&this->mutex_);
  __mutex = SharedMemoryObject<pthread_mutex_t>::get(this_00);
  iVar1 = pthread_mutex_init((pthread_mutex_t *)__mutex,local_28);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_88,"Failed to initialize mutex: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  iVar1 = pthread_mutexattr_destroy(local_28);
  if (iVar1 != 0) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_a8,"Failed to destroy mutexattr: %m");
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  _Var2 = getpid();
  this->owner_pid_ = _Var2;
  return;
}

Assistant:

SharedMutex::SharedMutex() {
    mutex_ = std::make_unique<SharedMemoryObject<pthread_mutex_t>>();
    pthread_mutexattr_t mutexattr;
    if (pthread_mutexattr_init(&mutexattr) != 0) {
        die(format("Failed to initialize mutexattr: %m"));
    }
    if (pthread_mutexattr_setpshared(&mutexattr, PTHREAD_PROCESS_SHARED) != 0) {
        die(format("Failed to set PTHREAD_PROCESS_SHARED to mutexattr: %m"));
    }
    if (pthread_mutex_init(mutex_->get(), &mutexattr)) {
        die(format("Failed to initialize mutex: %m"));
    }
    if (pthread_mutexattr_destroy(&mutexattr) != 0) {
        die(format("Failed to destroy mutexattr: %m"));
    }
    owner_pid_ = getpid();
}